

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O0

bool __thiscall
spvtools::SpirvTools::Validate
          (SpirvTools *this,uint32_t *binary,size_t binary_size,spv_validator_options options)

{
  bool bVar1;
  spv_result_t sVar2;
  pointer pIVar3;
  spv_diagnostic psStack_40;
  bool valid;
  spv_diagnostic diagnostic;
  spv_const_binary_t the_binary;
  spv_validator_options options_local;
  size_t binary_size_local;
  uint32_t *binary_local;
  SpirvTools *this_local;
  
  psStack_40 = (spv_diagnostic)0x0;
  diagnostic = (spv_diagnostic)binary;
  the_binary.code = (uint32_t *)binary_size;
  the_binary.wordCount = (size_t)options;
  pIVar3 = std::
           unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
           ::operator->(&this->impl_);
  sVar2 = spvValidateWithOptions
                    (pIVar3->context,(spv_const_validator_options)the_binary.wordCount,
                     (spv_const_binary)&diagnostic,&stack0xffffffffffffffc0);
  if (sVar2 != SPV_SUCCESS) {
    pIVar3 = std::
             unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
             ::operator->(&this->impl_);
    bVar1 = std::function::operator_cast_to_bool((function *)&pIVar3->context->consumer);
    if (bVar1) {
      pIVar3 = std::
               unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
               ::operator->(&this->impl_);
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar3->context->consumer,SPV_MSG_ERROR,(char *)0x0,&psStack_40->position,
                   psStack_40->error);
    }
  }
  spvDiagnosticDestroy(psStack_40);
  return sVar2 == SPV_SUCCESS;
}

Assistant:

bool SpirvTools::Validate(const uint32_t* binary, const size_t binary_size,
                          spv_validator_options options) const {
  spv_const_binary_t the_binary{binary, binary_size};
  spv_diagnostic diagnostic = nullptr;
  bool valid = spvValidateWithOptions(impl_->context, options, &the_binary,
                                      &diagnostic) == SPV_SUCCESS;
  if (!valid && impl_->context->consumer) {
    impl_->context->consumer.operator()(
        SPV_MSG_ERROR, nullptr, diagnostic->position, diagnostic->error);
  }
  spvDiagnosticDestroy(diagnostic);
  return valid;
}